

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

Own<kj::MainBuilder::Impl> __thiscall
kj::heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
          (kj *this,ProcessContext *params,StringPtr *params_1,StringPtr *params_2,
          StringPtr *params_3)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  undefined8 *puVar6;
  Impl *extraout_RDX;
  Own<kj::MainBuilder::Impl> OVar7;
  
  puVar6 = (undefined8 *)operator_new(0x120);
  pcVar1 = (params_1->content).ptr;
  sVar2 = (params_1->content).size_;
  pcVar3 = (params_2->content).ptr;
  sVar4 = (params_2->content).size_;
  sVar5 = (params_3->content).size_;
  puVar6[5] = (params_3->content).ptr;
  puVar6[6] = sVar5;
  *puVar6 = params;
  puVar6[1] = pcVar1;
  puVar6[2] = sVar2;
  puVar6[3] = pcVar3;
  puVar6[4] = sVar4;
  Arena::Arena((Arena *)(puVar6 + 7),0x400);
  *(undefined4 *)(puVar6 + 0xc) = 0;
  puVar6[0xd] = 0;
  puVar6[0xe] = puVar6 + 0xc;
  puVar6[0xf] = puVar6 + 0xc;
  puVar6[0x10] = 0;
  *(undefined4 *)(puVar6 + 0x12) = 0;
  puVar6[0x13] = 0;
  puVar6[0x14] = puVar6 + 0x12;
  puVar6[0x15] = puVar6 + 0x12;
  puVar6[0x16] = 0;
  *(undefined4 *)(puVar6 + 0x18) = 0;
  puVar6[0x19] = 0;
  puVar6[0x1a] = puVar6 + 0x18;
  puVar6[0x1b] = puVar6 + 0x18;
  *(undefined1 *)(puVar6 + 0x21) = 0;
  puVar6[0x1c] = 0;
  puVar6[0x1d] = 0;
  puVar6[0x1e] = 0;
  puVar6[0x1f] = 0;
  *(undefined8 **)this = &_::HeapDisposer<kj::MainBuilder::Impl>::instance;
  *(undefined8 **)(this + 8) = puVar6;
  OVar7.ptr = extraout_RDX;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}